

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::ObjFileImporter::InternReadFile
          (ObjFileImporter *this,string *file,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  long lVar4;
  Model *pModel;
  undefined4 extraout_var_00;
  DeadlyImportError *pDVar5;
  int __oflag;
  string modelName;
  IOStreamBuffer<char> streamedBuffer;
  string folderName;
  ObjFileParser parser;
  long *__file;
  
  if (InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::mode_abi_cxx11_ ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)
                                 ::mode_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                  mode_abi_cxx11_,"rb",(allocator *)&parser);
      __cxa_atexit(std::__cxx11::string::~string,
                   &InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                    mode_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                           mode_abi_cxx11_);
    }
  }
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(file->_M_dataplus)._M_p,
                     InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                     mode_abi_cxx11_._M_dataplus._M_p);
  __file = (long *)CONCAT44(extraout_var,iVar2);
  if (__file != (long *)0x0) {
    uVar3 = (**(code **)(*__file + 0x30))(__file);
    if (0xf < uVar3) {
      IOStreamBuffer<char>::IOStreamBuffer(&streamedBuffer,0x1000000);
      IOStreamBuffer<char>::open(&streamedBuffer,(char *)__file,__oflag);
      modelName._M_dataplus._M_p = (pointer)&modelName.field_2;
      modelName._M_string_length = 0;
      modelName.field_2._M_local_buf[0] = '\0';
      folderName._M_dataplus._M_p = (pointer)&folderName.field_2;
      folderName._M_string_length = 0;
      folderName.field_2._M_local_buf[0] = '\0';
      lVar4 = std::__cxx11::string::find_last_of((char *)file,0x62ad96);
      if (lVar4 == -1) {
        std::__cxx11::string::_M_assign((string *)&modelName);
      }
      else {
        std::__cxx11::string::substr((ulong)&parser,(ulong)file);
        std::__cxx11::string::operator=((string *)&modelName,(string *)&parser);
        std::__cxx11::string::~string((string *)&parser);
        std::__cxx11::string::substr((ulong)&parser,(ulong)file);
        std::__cxx11::string::operator=((string *)&folderName,(string *)&parser);
        std::__cxx11::string::~string((string *)&parser);
        if (folderName._M_string_length != 0) {
          (*pIOHandler->_vptr_IOSystem[7])(pIOHandler,&folderName);
        }
      }
      ObjFileParser::ObjFileParser
                (&parser,&streamedBuffer,&modelName,pIOHandler,(this->super_BaseImporter).m_progress
                 ,file);
      pModel = ObjFileParser::GetModel(&parser);
      CreateDataFromImport(this,pModel,pScene);
      if (streamedBuffer.m_stream != (IOStream *)0x0) {
        streamedBuffer.m_stream = (IOStream *)0x0;
        streamedBuffer.m_filesize = 0;
        streamedBuffer.m_numBlocks = 0;
        streamedBuffer.m_blockIdx = 0;
        streamedBuffer.m_cachePos = 0;
        streamedBuffer.m_filePos = 0;
      }
      pcVar1 = (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar1) {
        (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar1;
      }
      iVar2 = (*pIOHandler->_vptr_IOSystem[9])(pIOHandler);
      if (CONCAT44(extraout_var_00,iVar2) != 0) {
        (*pIOHandler->_vptr_IOSystem[10])(pIOHandler);
      }
      ObjFileParser::~ObjFileParser(&parser);
      std::__cxx11::string::~string((string *)&folderName);
      std::__cxx11::string::~string((string *)&modelName);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&streamedBuffer.m_cache.super__Vector_base<char,_std::allocator<char>_>);
      (**(code **)(*__file + 8))(__file);
      return;
    }
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&parser,"OBJ-file is too small.",(allocator *)&streamedBuffer);
    DeadlyImportError::DeadlyImportError(pDVar5,(string *)&parser);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &streamedBuffer,"Failed to open file ",file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &streamedBuffer,".");
  DeadlyImportError::DeadlyImportError(pDVar5,(string *)&parser);
  __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ObjFileImporter::InternReadFile( const std::string &file, aiScene* pScene, IOSystem* pIOHandler) {
    // Read file into memory
    static const std::string mode = "rb";
    std::unique_ptr<IOStream> fileStream( pIOHandler->Open( file, mode));
    if( !fileStream.get() ) {
        throw DeadlyImportError( "Failed to open file " + file + "." );
    }

    // Get the file-size and validate it, throwing an exception when fails
    size_t fileSize = fileStream->FileSize();
    if( fileSize < ObjMinSize ) {
        throw DeadlyImportError( "OBJ-file is too small.");
    }

    IOStreamBuffer<char> streamedBuffer;
    streamedBuffer.open( fileStream.get() );

    // Allocate buffer and read file into it
    //TextFileToBuffer( fileStream.get(),m_Buffer);

    // Get the model name
    std::string  modelName, folderName;
    std::string::size_type pos = file.find_last_of( "\\/" );
    if ( pos != std::string::npos ) {
        modelName = file.substr(pos+1, file.size() - pos - 1);
        folderName = file.substr( 0, pos );
        if ( !folderName.empty() ) {
            pIOHandler->PushDirectory( folderName );
        }
    } else {
        modelName = file;
    }

    // parse the file into a temporary representation
    ObjFileParser parser( streamedBuffer, modelName, pIOHandler, m_progress, file);

    // And create the proper return structures out of it
    CreateDataFromImport(parser.GetModel(), pScene);

    streamedBuffer.close();

    // Clean up allocated storage for the next import
    m_Buffer.clear();

    // Pop directory stack
    if ( pIOHandler->StackSize() > 0 ) {
        pIOHandler->PopDirectory();
    }
}